

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
::create_initial_page
          (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  ControlBlock *pCVar1;
  ControlBlock *__p;
  __pointer_type pLVar2;
  ControlBlock *pCVar3;
  ControlBlock *initial_page;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  *this_local;
  
  __p = create_page(this,i_progress_guarantee);
  if (__p == (ControlBlock *)0x0) {
    this_local = (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
                  *)0x0;
  }
  else {
    pLVar2 = std::atomic<density::detail::LfQueueControl_*>::load
                       (&this->m_initial_page,memory_order_seq_cst);
    if (pLVar2 != (__pointer_type)0x0) {
      density_tests::detail::assert_failed<>
                ("m_initial_page.load() == nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0x176);
    }
    std::atomic<density::detail::LfQueueControl_*>::store
              (&this->m_initial_page,__p,memory_order_seq_cst);
    pCVar1 = this->m_tail;
    pCVar3 = invalid_control_block();
    if (pCVar1 != pCVar3) {
      density_tests::detail::assert_failed<>
                ("m_tail == invalid_control_block()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0x17a);
    }
    this->m_tail = __p;
    this_local = (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
                  *)this->m_tail;
  }
  return (ControlBlock *)this_local;
}

Assistant:

ControlBlock * create_initial_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                auto const initial_page = create_page(i_progress_guarantee);
                if (initial_page == nullptr)
                {
                    return nullptr;
                }
                DENSITY_ASSERT_INTERNAL(m_initial_page.load() == nullptr);
                m_initial_page.store(initial_page);

                // m_tail = initial_page;
                DENSITY_ASSERT_INTERNAL(m_tail == invalid_control_block());
                m_tail = initial_page;

                return m_tail;
            }